

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpClient.cpp
# Opt level: O1

void xmrig::HttpClient::onConnect(uv_connect_t *req,int status)

{
  HttpContext *this;
  undefined8 uVar1;
  _Rb_tree_color _Var2;
  undefined8 uVar3;
  
  this = (HttpContext *)req->data;
  if (this == (HttpContext *)0x0) {
    operator_delete(req);
    return;
  }
  if (-1 < status) {
    uv_read_start(this->m_tcp,onConnect::anon_class_1_0_00000001::__invoke,
                  onConnect::anon_class_1_0_00000001::__invoke);
    (*this->_vptr_HttpContext[3])(this);
    return;
  }
  if ((char)this[1].super_HttpData.method == '\0') {
    uVar1 = *(undefined8 *)(*(long *)&this[1].super_HttpData.headers._M_t._M_impl + 0x70);
    _Var2 = this[1].super_HttpData.headers._M_t._M_impl.super__Rb_tree_header._M_header._M_color;
    uVar3 = uv_strerror(status);
    Log::print(ERR,"[%s:%d] connect error: \"%s\"",uVar1,(ulong)(ushort)(short)_Var2,uVar3);
  }
  operator_delete(req);
  HttpContext::close(this,status);
  return;
}

Assistant:

void xmrig::HttpClient::onConnect(uv_connect_t *req, int status)
{
    auto client = static_cast<HttpClient *>(req->data);
    if (!client) {
        delete req;
        return;
    }

    if (status < 0) {
        if (!client->m_quiet) {
            LOG_ERR("[%s:%d] connect error: \"%s\"", client->m_dns->host().data(), client->m_port, uv_strerror(status));
        }

        delete req;
        client->close(status);
        return;
    }

    uv_read_start(client->stream(),
        [](uv_handle_t *, size_t suggested_size, uv_buf_t *buf)
        {
            buf->base = new char[suggested_size];

#           ifdef _WIN32
            buf->len = static_cast<unsigned int>(suggested_size);
#           else
            buf->len = suggested_size;
#           endif
        },
        [](uv_stream_t *tcp, ssize_t nread, const uv_buf_t *buf)
        {
            auto client = static_cast<HttpClient*>(tcp->data);

            if (nread >= 0) {
                client->read(buf->base, static_cast<size_t>(nread));
            } else {
                if (!client->m_quiet && nread != UV_EOF) {
                    LOG_ERR("[%s:%d] read error: \"%s\"", client->m_dns->host().data(), client->m_port, uv_strerror(static_cast<int>(nread)));
                }

                client->close(static_cast<int>(nread));
            }

            delete [] buf->base;
        });

    client->handshake();
}